

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O0

Value __thiscall xmrig::OclConfig::toJSON(OclConfig *this,Document *doc)

{
  bool bVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  Value VVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *obj;
  undefined4 in_stack_ffffffffffffff48;
  Type in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff68;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_78;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  StringRefType *in_stack_ffffffffffffffa8;
  Threads<xmrig::OclThreads> *in_stack_ffffffffffffffb0;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GetAllocator(in_RDX);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_RDI,in_stack_ffffffffffffff4c);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                  (bool)in_stack_ffffffffffffffa7,in_stack_ffffffffffffff98);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                  (bool)in_stack_ffffffffffffffa7,in_stack_ffffffffffffff98);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  String::toJSON((String *)in_stack_ffffffffffffff68);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
            in_stack_ffffffffffffff98);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_78);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar1 = String::isEmpty((String *)0x20f32b);
  if (bVar1) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(in_RDI,CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c));
  }
  else {
    String::toJSON((String *)in_stack_ffffffffffffff68);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
            in_stack_ffffffffffffff98);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffff68);
  Threads<xmrig::OclThreads>::toJSON
            (in_stack_ffffffffffffffb0,(Value *)in_stack_ffffffffffffffa8,
             (Document *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  VVar2.data_.s.str = (Ch *)extraout_RDX;
  VVar2.data_.n = (Number)in_RDI;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::OclConfig::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value obj(kObjectType);

    obj.AddMember(StringRef(kEnabled),  m_enabled, allocator);
    obj.AddMember(StringRef(kCache),    m_cache, allocator);
    obj.AddMember(StringRef(kLoader),   m_loader.toJSON(), allocator);
    obj.AddMember(StringRef(kPlatform), m_platformVendor.isEmpty() ? Value(m_platformIndex) : m_platformVendor.toJSON(), allocator);

    m_threads.toJSON(obj, doc);

    return obj;
}